

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondEpsGen.h
# Opt level: O2

void __thiscall
covenant::CondEpsGen<covenant::Sym>::CondEpsGen
          (CondEpsGen<covenant::Sym> *this,cfg_digest_t *_digest,
          vector<int,_std::allocator<int>_> *_word,TermFactory *tfac)

{
  sp_counted_base *psVar1;
  _Rb_tree_node_base *p_Var2;
  pointer piVar3;
  int iVar4;
  pointer piVar5;
  uint uVar6;
  uint qi;
  uint ci;
  int iVar7;
  ulong uVar8;
  emplace_return eVar9;
  allocator_type local_79;
  _Vector_base<int,_std::allocator<int>_> local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_60;
  shared_count *local_58;
  vector<bool,_std::allocator<bool>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  this->digest = _digest;
  std::vector<int,_std::allocator<int>_>::vector(&this->word,_word);
  iVar4 = (int)((ulong)((long)(this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2) + 1;
  this->nstates = iVar4;
  iVar7 = this->digest->nprods;
  this->nprods = iVar7;
  local_38 = &this->produce_fwd;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_38,(long)(iVar4 * iVar7),(value_type *)&local_78,&local_79);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  local_40 = &this->produce_rev;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_40,(long)this->nprods * (long)this->nstates,(value_type *)&local_78,&local_79);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  local_50 = &this->produced;
  local_78._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_48 = &this->word;
  std::vector<bool,_std::allocator<bool>_>::vector
            (local_50,(long)this->nprods * (long)this->nstates * (long)this->nstates,
             (bool *)&local_78,(allocator_type *)&local_79);
  this->head = 0;
  local_60 = &this->eps_preds;
  (this->lim).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->lim).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->lim).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->added).
  super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->added).
  super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->added).
  super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->declim).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->declim).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->declim).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->decisions).
  super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->decisions).
  super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->decisions).
  super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_60,(long)this->nstates,(value_type *)&local_78,&local_79);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->eps_succs,(long)this->nstates,(value_type *)&local_78,&local_79);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  (this->_tfac).px = tfac->px;
  psVar1 = (tfac->pn).pi_;
  (this->_tfac).pn.pi_ = psVar1;
  if (psVar1 != (sp_counted_base *)0x0) {
    LOCK();
    psVar1->use_count_ = psVar1->use_count_ + 1;
    UNLOCK();
  }
  local_58 = &(this->_tfac).pn;
  uVar6 = 0;
  while( true ) {
    qi = uVar6;
    piVar3 = (this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)piVar5 - (long)piVar3 >> 2) <= (ulong)qi) break;
    eVar9 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,int,std::set<int,std::less<int>,std::allocator<int>>,boost::hash<int>,std::equal_to<int>>>
            ::try_emplace_unique<int_const&>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,int,std::set<int,std::less<int>,std::allocator<int>>,boost::hash<int>,std::equal_to<int>>>
                        *)&this->digest->term_prods,piVar3 + qi);
    for (p_Var2 = *(_Rb_tree_node_base **)
                   ((long)&((eVar9.first.node_.node_)->value_base_).data_.data_ + 0x20);
        uVar6 = qi + 1,
        p_Var2 != (_Rb_tree_node_base *)
                  ((long)&((eVar9.first.node_.node_)->value_base_).data_.data_ + 0x10);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      addProd(this,qi,p_Var2[1]._M_color,qi + 1);
    }
  }
  uVar8 = 0;
  while (iVar7 = (int)uVar8, uVar8 <= (ulong)((long)piVar5 - (long)piVar3 >> 2)) {
    uVar6 = 0;
    while( true ) {
      piVar3 = (this->digest->nullable_prods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->digest->nullable_prods).super__Vector_base<int,_std::allocator<int>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <=
          (ulong)uVar6) break;
      addProd(this,iVar7,piVar3[uVar6],iVar7);
      uVar6 = uVar6 + 1;
    }
    piVar3 = (this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar8 = (ulong)(iVar7 + 1);
  }
  update_prods(this);
  return;
}

Assistant:

CondEpsGen(cfg_digest_t& _digest, const vector<int>& _word, TermFactory tfac)
        : digest(_digest), word(_word),
          nstates(1+word.size()), nprods(digest.nprods),
          produce_fwd(vector< vector<int> >(nstates*nprods, vector<int>())),
          produce_rev(vector< vector<int> >(nstates*nprods, vector<int>())),
          produced(vector<bool>(nstates*nstates*nprods, false)),
          //      produced((bool*) calloc(nstates*nstates*nprods, sizeof(bool))),
          head(0),
          eps_preds(nstates, vector<int>()),
          eps_succs(nstates, vector<int>()),
          _tfac(tfac)
    {
      // Assumption -- g is semi-normalized.
      // Single productions may be nullable, but
      // terminals may only occur in singleton productions; this means
      // we only need |P||Q|^2 space, rather than (|P|+|Sigma|)|Q|^2.
      
      // Initialize the leaf transitions.  
      for(unsigned int ci = 0; ci < word.size(); ci++)
      {
        set<int>& sing(digest.term_prods[word[ci]]);
        
        set<int>::iterator it;
        for(it = sing.begin(); it != sing.end(); ++it)
        {
          addProd(ci, *it, ci+1);
        }
      }
      
      // Add empty productions
      for(unsigned int ci = 0; ci <= word.size(); ci++)
      {
        for(unsigned int pi = 0; pi < digest.nullable_prods.size(); pi++)
        {
          addProd(ci, digest.nullable_prods[pi], ci);
        }
      }
      // Since we know we only recognize w, we can either
      // use the standard propagation approach, or use
      // a standard(-ish) CYK implementation.
      
      // For now, we'll use the worklist approach, since
      // it's already implemented.
      update_prods(); 
    }